

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O1

void __thiscall Assimp::B3DImporter::~B3DImporter(B3DImporter *this)

{
  pointer ppaVar1;
  pointer pVVar2;
  pointer puVar3;
  pointer puVar4;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0082e830;
  std::
  vector<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>,_std::allocator<std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>_>_>
  ::~vector(&this->_animations);
  std::
  vector<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>,_std::allocator<std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>_>_>
  ::~vector(&this->_nodeAnims);
  std::
  vector<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>,_std::allocator<std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>_>_>
  ::~vector(&this->_meshes);
  ppaVar1 = (this->_nodes).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppaVar1 != (pointer)0x0) {
    operator_delete(ppaVar1,(long)(this->_nodes).
                                  super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)ppaVar1);
  }
  pVVar2 = (this->_vertices).
           super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)(this->_vertices).
                                 super__Vector_base<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar2);
  }
  std::
  vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
  ::~vector(&this->_materials);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_textures);
  puVar3 = (this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->_stack).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  puVar4 = (this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4,(long)(this->_buf).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4);
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

B3DImporter::~B3DImporter()
{
}